

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Comparison.cpp
# Opt level: O2

bool CoreML::Specification::mapsEqual<CoreML::Specification::Int64ToDoubleMap>
               (Int64ToDoubleMap *a,Int64ToDoubleMap *b)

{
  double dVar1;
  value_type *key;
  double *pdVar2;
  bool bVar3;
  const_iterator __begin0;
  iterator_base<const_google::protobuf::Map<long,_double>::KeyValuePair> local_30;
  
  if ((int)((a->map_).map_.elements_)->num_elements_ ==
      (int)((b->map_).map_.elements_)->num_elements_) {
    google::protobuf::Map<long,_double>::begin((const_iterator *)&local_30,&(a->map_).map_);
    while (bVar3 = local_30.node_ == (Node *)0x0, !bVar3) {
      key = ((local_30.node_)->kv).v_;
      dVar1 = key->second;
      pdVar2 = google::protobuf::Map<long,_double>::at(&(b->map_).map_,&key->first);
      if (dVar1 != *pdVar2) {
        return bVar3;
      }
      if (NAN(dVar1) || NAN(*pdVar2)) {
        return bVar3;
      }
      google::protobuf::Map<long,_double>::InnerMap::
      iterator_base<const_google::protobuf::Map<long,_double>::KeyValuePair>::operator++(&local_30);
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool mapsEqual(const T& a, const T& b) {
            if (a.map_size() != b.map_size()) {
                return false;
            }
            for (const auto& p : a.map()) {
                if (p.second != b.map().at(p.first)) {
                    return false;
                }
            }
            return true;
        }